

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# midimixup.cpp
# Opt level: O2

void randomizeNotes(vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_> *notes)

{
  result_type_conflict1 rVar1;
  pointer ppVar2;
  pointer ppVar3;
  vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_> *notes_00;
  uint uVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  __normal_iterator<pairing_*,_std::vector<pairing,_std::allocator<pairing>_>_> __i;
  pointer ppVar8;
  size_type __new_size;
  long lVar9;
  ulong uVar10;
  vector<pairing,_std::allocator<pairing>_> neworder;
  random_device rd;
  mt19937 md;
  _Vector_base<pairing,_std::allocator<pairing>_> local_2788;
  size_type local_2768;
  vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_> *local_2760;
  uniform_real_distribution<double> local_2758;
  random_device local_2740;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  local_13b8;
  
  std::random_device::random_device(&local_2740);
  uVar4 = std::random_device::_M_getval();
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::seed(&local_13b8,(ulong)uVar4);
  local_2758._M_param._M_a._0_4_ = 0;
  local_2758._M_param._M_a._4_4_ = 0;
  local_2758._M_param._M_b._0_4_ = 0;
  local_2758._M_param._M_b._4_4_ = 0x40590000;
  __new_size = (long)(notes->super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>
                     )._M_impl.super__Vector_impl_data._M_finish -
               (long)(notes->super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>
                     )._M_impl.super__Vector_impl_data._M_start >> 3;
  local_2788._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2788._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2788._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<pairing,_std::allocator<pairing>_>::resize
            ((vector<pairing,_std::allocator<pairing>_> *)&local_2788,__new_size);
  lVar5 = 0;
  lVar9 = 0;
  local_2768 = __new_size;
  local_2760 = notes;
  while( true ) {
    ppVar3 = local_2788._M_impl.super__Vector_impl_data._M_finish;
    ppVar2 = local_2788._M_impl.super__Vector_impl_data._M_start;
    uVar7 = (long)local_2788._M_impl.super__Vector_impl_data._M_finish -
            (long)local_2788._M_impl.super__Vector_impl_data._M_start;
    if ((int)(uVar7 >> 4) <= lVar9) break;
    *(int *)((long)&(local_2788._M_impl.super__Vector_impl_data._M_start)->index + lVar5) =
         (int)lVar9;
    rVar1 = std::uniform_real_distribution<double>::operator()(&local_2758,&local_13b8);
    *(result_type_conflict1 *)
     ((long)&(local_2788._M_impl.super__Vector_impl_data._M_start)->value + lVar5) = rVar1;
    lVar9 = lVar9 + 1;
    lVar5 = lVar5 + 0x10;
  }
  if (local_2788._M_impl.super__Vector_impl_data._M_start !=
      local_2788._M_impl.super__Vector_impl_data._M_finish) {
    lVar5 = 0x3f;
    if ((long)uVar7 >> 4 != 0) {
      for (; (ulong)((long)uVar7 >> 4) >> lVar5 == 0; lVar5 = lVar5 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<pairing*,std::vector<pairing,std::allocator<pairing>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<randomizeNotes(std::vector<smf::MidiEvent*,std::allocator<smf::MidiEvent*>>&)::__0>>
              (local_2788._M_impl.super__Vector_impl_data._M_start,
               local_2788._M_impl.super__Vector_impl_data._M_finish,((uint)lVar5 ^ 0x3f) * 2 ^ 0x7e)
    ;
    if ((long)uVar7 < 0x101) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<pairing*,std::vector<pairing,std::allocator<pairing>>>,__gnu_cxx::__ops::_Iter_comp_iter<randomizeNotes(std::vector<smf::MidiEvent*,std::allocator<smf::MidiEvent*>>&)::__0>>
                (ppVar2,ppVar3);
    }
    else {
      ppVar8 = ppVar2 + 0x10;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<pairing*,std::vector<pairing,std::allocator<pairing>>>,__gnu_cxx::__ops::_Iter_comp_iter<randomizeNotes(std::vector<smf::MidiEvent*,std::allocator<smf::MidiEvent*>>&)::__0>>
                (ppVar2,ppVar8);
      for (; ppVar8 != ppVar3; ppVar8 = ppVar8 + 1) {
        std::
        __unguarded_linear_insert<__gnu_cxx::__normal_iterator<pairing*,std::vector<pairing,std::allocator<pairing>>>,__gnu_cxx::__ops::_Val_comp_iter<randomizeNotes(std::vector<smf::MidiEvent*,std::allocator<smf::MidiEvent*>>&)::__0>>
                  (ppVar8);
      }
    }
  }
  notes_00 = local_2760;
  uVar6 = 0;
  uVar7 = local_2768 & 0xffffffff;
  if ((int)local_2768 < 1) {
    uVar7 = uVar6;
  }
  for (uVar10 = 0; uVar7 != uVar10; uVar10 = uVar10 + 1) {
    swapNotes(notes_00,(int)uVar10,
              *(int *)((long)&(local_2788._M_impl.super__Vector_impl_data._M_start)->index + uVar6))
    ;
    uVar6 = uVar6 + 0x10;
  }
  std::_Vector_base<pairing,_std::allocator<pairing>_>::~_Vector_base(&local_2788);
  std::random_device::~random_device(&local_2740);
  return;
}

Assistant:

void randomizeNotes(vector<MidiEvent*>& notes) {
   random_device rd;
   mt19937 md(rd());
   uniform_real_distribution<double> dist(0, 100);
   int count = (int)notes.size();
   vector<pairing> neworder;
   neworder.resize(notes.size());
   int i;
   for (i=0; i<(int)neworder.size(); i++) {
      neworder[i].index = i;
      neworder[i].value = dist(md);
   }
   sort(neworder.begin(), neworder.end(),
      [](const pairing& a, const pairing& b) {
         return a.value > b.value;
      });

   for (i=0; i<count; i++) {
      swapNotes(notes, i, neworder[i].index);
   }
}